

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.hpp
# Opt level: O0

void __thiscall baryonyx::pnm_vector::~pnm_vector(pnm_vector *this)

{
  pointer puVar1;
  pnm_vector *this_local;
  
  while (0 < this->m_heigth) {
    puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (&this->m_buffer);
    size(this);
    std::ostream::write((char *)&this->m_ofs,(long)puVar1);
    this->m_heigth = this->m_heigth + -1;
  }
  std::ofstream::~ofstream(&this->m_ofs);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (&this->m_buffer);
  return;
}

Assistant:

~pnm_vector()
    {
        for (; m_heigth > 0; --m_heigth)
            m_ofs.write(reinterpret_cast<char*>(m_buffer.get()), size());
    }